

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O0

string * __thiscall zmq::message_t::str_abi_cxx11_(string *__return_storage_ptr__,message_t *this)

{
  byte bVar1;
  bool bVar2;
  _Setfill<char> _Var3;
  _Setw _Var4;
  ostream *poVar5;
  void *this_00;
  bool local_231;
  int is_ascii [2];
  size_t size;
  byte *pbStack_1a8;
  uchar byte;
  uchar *msg_data;
  stringstream os;
  ostream local_190 [376];
  message_t *local_18;
  message_t *this_local;
  
  local_18 = this;
  this_local = (message_t *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&msg_data);
  pbStack_1a8 = data<unsigned_char>(this);
  is_ascii = (int  [2])message_t::size(this);
  poVar5 = std::operator<<(local_190,"zmq::message_t [size ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
  _Var4 = std::setw(3);
  poVar5 = std::operator<<(poVar5,_Var4);
  _Var3 = std::setfill<char>('0');
  poVar5 = std::operator<<(poVar5,_Var3._M_c);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulong)is_ascii);
  std::operator<<(poVar5,"] (");
  bVar2 = false;
  if ((ulong)is_ascii < 1000) {
    while (is_ascii != (int  [2])0x0) {
      bVar1 = *pbStack_1a8;
      local_231 = 0x1f < bVar1 && bVar1 < 0x7f;
      if (local_231 != bVar2) {
        std::operator<<(local_190," ");
      }
      bVar2 = local_231;
      if (0x1f < bVar1 && bVar1 < 0x7f) {
        std::operator<<(local_190,bVar1);
        is_ascii = (int  [2])((long)is_ascii + -1);
        pbStack_1a8 = pbStack_1a8 + 1;
      }
      else {
        this_00 = (void *)std::ostream::operator<<(local_190,std::hex);
        poVar5 = (ostream *)std::ostream::operator<<(this_00,std::uppercase);
        _Var4 = std::setw(2);
        poVar5 = std::operator<<(poVar5,_Var4);
        _Var3 = std::setfill<char>('0');
        poVar5 = std::operator<<(poVar5,_Var3._M_c);
        std::ostream::operator<<(poVar5,(ushort)bVar1);
        is_ascii = (int  [2])((long)is_ascii + -1);
        pbStack_1a8 = pbStack_1a8 + 1;
      }
    }
    std::operator<<(local_190,")");
  }
  else {
    std::operator<<(local_190,"... too big to print)");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&msg_data);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
    {
        // Partly mutuated from the same method in zmq::multipart_t
        std::stringstream os;

        const unsigned char *msg_data = this->data<unsigned char>();
        unsigned char byte;
        size_t size = this->size();
        int is_ascii[2] = {0, 0};

        os << "zmq::message_t [size " << std::dec << std::setw(3)
           << std::setfill('0') << size << "] (";
        // Totally arbitrary
        if (size >= 1000) {
            os << "... too big to print)";
        } else {
            while (size--) {
                byte = *msg_data++;

                is_ascii[1] = (byte >= 32 && byte < 127);
                if (is_ascii[1] != is_ascii[0])
                    os << " "; // Separate text/non text

                if (is_ascii[1]) {
                    os << byte;
                } else {
                    os << std::hex << std::uppercase << std::setw(2)
                       << std::setfill('0') << static_cast<short>(byte);
                }
                is_ascii[0] = is_ascii[1];
            }
            os << ")";
        }
        return os.str();
    }